

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree
          (TaprootScriptTree *this,uint8_t leaf_version,Script *script,NetType network_type)

{
  uint8_t uVar1;
  bool bVar2;
  CfdException *this_00;
  undefined7 in_register_00000031;
  uint8_t leaf_version_local;
  allocator local_41;
  undefined1 local_40 [32];
  
  leaf_version_local = leaf_version;
  TapBranch::TapBranch(&this->super_TapBranch,network_type);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0078f468;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TapBranch).has_leaf_ = true;
  uVar1 = 0xc4;
  if ((this->super_TapBranch).is_elements_ == false) {
    uVar1 = leaf_version;
  }
  if ((int)CONCAT71(in_register_00000031,leaf_version) != 0xc0) {
    uVar1 = leaf_version;
  }
  (this->super_TapBranch).leaf_version_ = uVar1;
  Script::operator=(&(this->super_TapBranch).script_,script);
  bVar2 = TaprootUtil::IsValidLeafVersion(leaf_version);
  if (bVar2) {
    return;
  }
  local_40._0_8_ = "cfdcore_taproot.cpp";
  local_40._8_4_ = 0x21b;
  local_40._16_8_ = "TaprootScriptTree";
  logger::warn<unsigned_char&>
            ((CfdSourceLocation *)local_40,"Unsupported leaf version. [{}]",&leaf_version_local);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"Unsupported leaf version.",&local_41);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

TaprootScriptTree::TaprootScriptTree(
    uint8_t leaf_version, const Script& script, NetType network_type)
    : TapBranch(network_type) {
  has_leaf_ = true;
  leaf_version_ = leaf_version;
  if (is_elements_ && (leaf_version_ == kTapScriptLeafVersion)) {
    leaf_version_ = kElementsTapScriptLeafVersion;
  }
  script_ = script;
  if (!TaprootUtil::IsValidLeafVersion(leaf_version)) {
    warn(CFD_LOG_SOURCE, "Unsupported leaf version. [{}]", leaf_version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
}